

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000150d50 = 0x2e2e2e2e2e2e2e;
    uRam0000000000150d57 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00150d40 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000150d48 = 0x2e2e2e2e2e2e2e;
    DAT_00150d4f = 0x2e;
    _DAT_00150d30 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000150d38 = 0x2e2e2e2e2e2e2e2e;
    _DAT_00150d20 = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000150d28 = 0x2e2e2e2e2e2e2e2e;
    _line = 0x2e2e2e2e2e2e2e2e;
    uRam0000000000150d18 = 0x2e2e2e2e2e2e2e2e;
    DAT_00150d5f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printClosedHeader( std::string const& _name ) {
            printOpenHeader( _name );
            stream << getLineOfChars<'.'>() << "\n";
        }